

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes.c
# Opt level: O0

int djnz_rx_offset(em8051 *aCPU)

{
  int iVar1;
  int rx;
  em8051 *aCPU_local;
  
  iVar1 = (aCPU->mCodeMem[(int)(aCPU->mPC & aCPU->mCodeMemSize - 1U)] & 7) +
          ((int)(aCPU->mSFR[0x50] & 0x18) >> 3) * 8;
  aCPU->mLowerData[iVar1] = aCPU->mLowerData[iVar1] + 0xff;
  if (aCPU->mLowerData[iVar1] == '\0') {
    aCPU->mPC = aCPU->mPC + 2;
  }
  else {
    aCPU->mPC = (char)aCPU->mCodeMem[(int)(aCPU->mPC + 1U & aCPU->mCodeMemSize - 1U)] + 2 +
                aCPU->mPC;
  }
  return 1;
}

Assistant:

static int djnz_rx_offset(struct em8051 *aCPU)
{
    int rx = RX_ADDRESS;
    aCPU->mLowerData[rx]--;
    if (aCPU->mLowerData[rx])
    {
        PC += (signed char)OPERAND1 + 2;
    }
    else
    {
        PC += 2;
    }
    return 1;
}